

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

Vec4 __thiscall
tcu::ConstPixelBufferAccess::getPixel(ConstPixelBufferAccess *this,int x,int y,int z)

{
  ushort uVar1;
  ChannelOrder type;
  Channel CVar2;
  ushort uVar3;
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  undefined1 auVar6 [13];
  undefined1 auVar7 [14];
  uint uVar8;
  int iVar9;
  Float<unsigned_int,_8,_23,_127,_3U> FVar10;
  Float<unsigned_int,_8,_23,_127,_3U> FVar11;
  Float<unsigned_int,_8,_23,_127,_3U> FVar12;
  TextureSwizzle *pTVar13;
  uint uVar14;
  uint uVar15;
  Vector<float,_4> *res;
  uint uVar16;
  undefined4 in_register_00000034;
  ChannelOrder *pCVar17;
  ChannelOrder order;
  uint uVar18;
  int in_R8D;
  uint uVar19;
  int c;
  long lVar20;
  uint *puVar21;
  undefined1 auVar25 [14];
  undefined4 uVar22;
  TextureFormat TVar24;
  TextureFormat extraout_XMM0_Qa;
  undefined1 in_XMM0 [16];
  undefined1 auVar26 [16];
  undefined8 uVar23;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  TextureFormat TVar40;
  undefined1 in_XMM1 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [14];
  Vec4 VVar53;
  Float<unsigned_int,_5,_5,_15,_2U> local_3c;
  Float<unsigned_int,_5,_6,_15,_2U> local_38;
  Float<unsigned_int,_5,_6,_15,_2U> local_34;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  
  TVar40 = in_XMM1._0_8_;
  pCVar17 = (ChannelOrder *)CONCAT44(in_register_00000034,x);
  puVar21 = (uint *)((long)(int)(in_R8D * pCVar17[7]) + (long)(int)(z * pCVar17[6]) +
                    (long)(int)(y * pCVar17[5]) + *(undefined8 *)(pCVar17 + 8));
  type = pCVar17[1];
  auVar34._4_12_ = in_XMM0._4_12_;
  auVar42._4_12_ = in_XMM1._4_12_;
  switch(type) {
  case L:
    order = *pCVar17;
    switch(order) {
    case RGB:
    case sRGB:
      auVar34._0_4_ = (float)*(byte *)((long)puVar21 + 2) / 255.0;
      TVar24 = auVar34._0_8_;
      auVar41._0_4_ = (float)((ushort)*puVar21 & 0xff);
      auVar41._4_4_ = (float)(byte)((ushort)*puVar21 >> 8);
      auVar41._8_8_ = 0;
      auVar34 = divps(auVar41,_DAT_009e8b60);
      TVar40 = auVar34._0_8_;
      goto LAB_008f4a58;
    case RGBA:
    case sRGBA:
      uVar8 = *puVar21;
      TVar40.order = R;
      TVar40.type = SNORM_INT8;
      auVar6[0xc] = (char)(uVar8 >> 0x18);
      auVar6._0_12_ = ZEXT712(0);
      auVar39._0_4_ = (float)(uVar8 & 0xff);
      auVar39._4_4_ = (float)(uVar8 >> 8 & 0xff);
      auVar39._8_4_ = (float)(int)CONCAT32(auVar6._10_3_,(ushort)(byte)(uVar8 >> 0x10));
      auVar39._12_4_ = (float)(uint3)(auVar6._10_3_ >> 0x10);
      auVar36 = divps(auVar39,_DAT_0096a6b0);
      break;
    default:
      goto switchD_008f4427_caseD_9;
    }
    goto LAB_008f4895;
  default:
    order = *pCVar17;
switchD_008f4427_caseD_9:
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    pTVar13 = getChannelReadSwizzle(order);
    iVar9 = getChannelSize(type);
    lVar20 = 0;
    auVar30 = extraout_XMM0;
    do {
      CVar2 = pTVar13->components[lVar20];
      if (CVar2 < CHANNEL_ZERO) {
        auVar30._0_4_ =
             anon_unknown_74::channelToFloat
                       ((byte *)((long)(int)(CVar2 * iVar9) + (long)puVar21),pCVar17[1]);
        auVar30._4_12_ = extraout_var;
LAB_008f4697:
        (this->m_size).m_data[lVar20 + -2] = auVar30._0_4_;
      }
      else {
        if (CVar2 == CHANNEL_ZERO) {
          auVar30 = ZEXT816(0);
          goto LAB_008f4697;
        }
        if (CVar2 == CHANNEL_ONE) {
          auVar30._0_12_ = ZEXT812(0x3f800000);
          auVar30._12_4_ = 0;
          goto LAB_008f4697;
        }
      }
      TVar40 = in_XMM1._0_8_;
      TVar24 = auVar30._0_8_;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 4);
    break;
  case RGB:
    auVar27._0_4_ = (float)(byte)((byte)*puVar21 >> 4);
    auVar27._4_4_ = (float)((byte)*puVar21 & 0xf);
    auVar27._8_8_ = 0;
    auVar34 = divps(auVar27,_DAT_009e8b50);
    TVar24 = auVar34._0_8_;
    this->m_format = TVar24;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0x3f800000;
    break;
  case RGBA:
    uVar1 = (ushort)*puVar21;
    auVar31._0_4_ = (float)(uVar1 >> 0xb);
    auVar31._4_4_ = (float)(uVar1 >> 5 & 0x3f);
    auVar31._8_8_ = 0;
    auVar34 = divps(auVar31,_DAT_009e8b40);
    TVar24 = auVar34._0_8_;
    auVar44._0_4_ = (float)(uVar1 & 0x1f) / 31.0;
    auVar44._4_12_ = auVar42._4_12_;
    TVar40 = auVar44._0_8_;
    if (*pCVar17 == RGB) {
      this->m_format = TVar24;
      (this->m_size).m_data[0] = (int)auVar44._0_4_;
    }
    else {
      (this->m_format).order = (ChannelOrder)auVar44._0_4_;
      TVar24.type = auVar34._0_4_;
      TVar24.order = (float)auVar34._4_4_;
      *(TextureFormat *)&(this->m_format).type = TVar24;
    }
    goto LAB_008f4a6e;
  case ARGB:
    uVar1 = (ushort)*puVar21;
    auVar29._0_4_ = (float)(uVar1 >> 10 & 0x1f) / 31.0;
    auVar29._4_12_ = auVar34._4_12_;
    TVar24 = auVar29._0_8_;
    auVar25 = ZEXT414(CONCAT22(uVar1,uVar1 >> 5)) & DAT_009e8a90._0_14_;
    auVar43._0_4_ = (float)auVar25._0_2_;
    auVar43._4_4_ = (float)(int)CONCAT82(SUB148(ZEXT214(0) << 0x40,6),auVar25._2_2_);
    auVar43._8_8_ = 0;
    auVar34 = divps(auVar43,_DAT_009e8aa0);
    TVar40 = auVar34._0_8_;
    if (*pCVar17 != RGB) {
      TVar40.type = auVar34._0_4_;
      TVar40.order = auVar34._4_4_;
      goto LAB_008f4a58;
    }
    (this->m_format).order = (ChannelOrder)auVar29._0_4_;
    *(TextureFormat *)&(this->m_format).type = TVar40;
    goto LAB_008f4a6e;
  case BGR:
    uVar1 = (ushort)*puVar21;
    auVar34 = ZEXT616(CONCAT24(uVar1 >> 4,CONCAT22(uVar1 >> 8,uVar1)));
    auVar34 = pshuflw(auVar34,auVar34,0x24);
    auVar34 = auVar34 & _DAT_009e8b10 & _DAT_009e8b20;
    TVar40 = auVar34._0_8_;
    auVar52 = ~DAT_009e8b20._0_14_ & ZEXT214(uVar1 >> 0xc) | auVar34._0_14_;
    auVar25._10_2_ = 0;
    auVar25._0_10_ = auVar52._0_10_;
    auVar25._12_2_ = auVar52._6_2_;
    auVar4._8_2_ = auVar52._4_2_;
    auVar4._0_8_ = auVar52._0_8_;
    auVar4._10_4_ = auVar25._10_4_;
    auVar7._6_8_ = 0;
    auVar7._0_6_ = auVar4._8_6_;
    auVar5._4_2_ = auVar52._2_2_;
    auVar5._0_4_ = auVar52._0_4_;
    auVar5._6_8_ = SUB148(auVar7 << 0x40,6);
    auVar26._0_4_ = (float)(auVar52._0_4_ & 0xffff);
    auVar26._4_4_ = (float)auVar5._4_4_;
    auVar26._8_4_ = (float)auVar4._8_4_;
    auVar26._12_4_ = (float)(auVar25._10_4_ >> 0x10);
    auVar36 = divps(auVar26,_DAT_009e8b30);
    goto LAB_008f48e1;
  case BGRA:
    uVar1 = (ushort)*puVar21;
    auVar28._0_4_ = (float)(uVar1 >> 0xb);
    auVar28._4_4_ = (float)(uVar1 >> 6 & 0x1f);
    auVar28._8_8_ = 0;
    auVar34 = divps(auVar28,_DAT_009e8aa0);
    TVar24 = auVar34._0_8_;
    auVar42._0_4_ = (float)(uVar1 >> 1 & 0x1f) / 31.0;
    TVar40 = auVar42._0_8_;
    if (*pCVar17 == RGBA) {
      this->m_format = TVar24;
      (this->m_size).m_data[0] = (int)auVar42._0_4_;
    }
    else {
      (this->m_format).order = (ChannelOrder)auVar42._0_4_;
      TVar24.type = auVar34._0_4_;
      TVar24.order = (float)auVar34._4_4_;
      *(TextureFormat *)&(this->m_format).type = TVar24;
    }
    (this->m_size).m_data[1] = (int)(float)(uVar1 & 1);
    break;
  case sR:
    uVar1 = (ushort)*puVar21;
    auVar45._0_4_ = (float)(uVar1 >> 0xf);
    auVar45._4_12_ = auVar42._4_12_;
    TVar40 = auVar45._0_8_;
    auVar25 = ZEXT414(CONCAT22(uVar1,uVar1 >> 5)) & DAT_009e8a90._0_14_;
    (this->m_format).order = (ChannelOrder)((float)(uVar1 >> 10 & 0x1f) / 31.0);
    auVar32._0_4_ = (float)auVar25._0_2_;
    auVar32._4_4_ = (float)(int)CONCAT82(SUB148(ZEXT214(0) << 0x40,6),auVar25._2_2_);
    auVar32._8_8_ = 0;
    auVar34 = divps(auVar32,_DAT_009e8aa0);
    TVar24 = auVar34._0_8_;
    *(TextureFormat *)&(this->m_format).type = TVar24;
    (this->m_size).m_data[1] = (int)auVar45._0_4_;
    break;
  case sRG:
    uVar8 = *puVar21;
    auVar33._0_4_ = (float)(uVar8 >> 2 & 0x3ff) / 1023.0;
    auVar33._4_12_ = auVar34._4_12_;
    TVar24 = auVar33._0_8_;
    auVar46._0_4_ = (float)(uVar8 >> 0x16);
    auVar46._4_4_ = (float)(uVar8 >> 0xc & 0x3ff);
    auVar46._8_8_ = 0;
    auVar34 = divps(auVar46,_DAT_009e8b00);
    TVar40 = auVar34._0_8_;
LAB_008f4a58:
    this->m_format = TVar40;
    (this->m_size).m_data[0] = TVar24.order;
    goto LAB_008f4a6e;
  case sRGB:
    uVar8 = *puVar21;
    TVar24.order = (float)(int)(-(uVar8 & 0x200) | uVar8 & 0x3ff) / 511.0;
    auVar49._0_4_ = (float)(int)(-(uVar8 >> 10 & 0x200) | uVar8 >> 10 & 0x3ff);
    auVar49._4_4_ = (float)(int)(-(uVar8 >> 0x14 & 0x200) | uVar8 >> 0x14 & 0x3ff);
    auVar49._8_8_ = 0;
    auVar34 = divps(auVar49,_DAT_009e8ad0);
    TVar24.type = auVar34._0_4_;
    auVar37._8_4_ = auVar34._4_4_;
    auVar37._0_4_ = TVar24.order;
    auVar37._4_4_ = auVar34._0_4_;
    auVar37._12_4_ = (float)(int)(-(uVar8 >> 0x1e & 0xfffffffe) | uVar8 >> 0x1e);
    auVar50 = maxps(_DAT_00945980,auVar37);
    if (*pCVar17 != RGBA) {
      uVar22 = auVar50._0_4_;
      auVar50._0_4_ = (float)auVar50._8_4_;
      auVar50._8_4_ = (float)uVar22;
    }
    goto LAB_008f4989;
  case sRGBA:
    uVar8 = *puVar21;
    TVar40.type = SNORM_INT8;
    TVar40.order = uVar8 >> 0x14;
    auVar35._0_4_ = (float)(uVar8 & 0x3ff);
    auVar35._4_4_ = (float)(uVar8 >> 10 & 0x3ff);
    auVar35._8_4_ = (float)(uVar8 >> 0x14 & 0x3ff);
    auVar35._12_4_ = (float)(uVar8 >> 0x1e);
    auVar36 = divps(auVar35,_DAT_009e8af0);
LAB_008f48e1:
    if (*pCVar17 != RGBA) {
      uVar22 = auVar36._0_4_;
      auVar36._0_4_ = (float)auVar36._8_4_;
      auVar36._8_4_ = (float)uVar22;
    }
    goto LAB_008f4895;
  case sBGR:
    auVar48._0_8_ = (ulong)CONCAT14((byte)*puVar21,(uint)(byte)((byte)*puVar21 >> 4)) & 0xfffffffff;
    auVar48._8_4_ = 0;
    auVar48._12_4_ = 1;
    goto LAB_008f4892;
  case sBGRA:
    uVar1 = (ushort)*puVar21;
    uVar15 = (uint)(uVar1 >> 0xb);
    uVar16 = uVar1 >> 5 & 0x3f;
    uVar8 = uVar1 & 0x1f;
    if (*pCVar17 != RGB) {
      uVar8 = uVar15;
      uVar15 = uVar1 & 0x1f;
    }
    uVar23 = CONCAT44(1,uVar8);
    goto LAB_008f488a;
  case D:
    uVar1 = (ushort)*puVar21;
    uVar3 = uVar1 >> 0xc;
    uVar16 = uVar1 >> 8 & 0xf;
    uVar14 = uVar1 >> 4 & 0xf;
    uVar8 = uVar1 & 0xf;
    goto LAB_008f451e;
  case S:
    uVar1 = (ushort)*puVar21;
    uVar3 = uVar1 >> 0xb;
    uVar16 = uVar1 >> 6 & 0x1f;
    uVar14 = uVar1 >> 1 & 0x1f;
    uVar8 = uVar1 & 1;
LAB_008f451e:
    uVar15 = (uint)uVar3;
    uVar18 = uVar14;
    if (*pCVar17 != RGBA) {
      uVar18 = uVar15;
      uVar15 = uVar14;
    }
    uVar23 = CONCAT44(uVar8,uVar18);
    goto LAB_008f488a;
  case DS:
    uVar8 = *puVar21;
    uVar15 = -(uVar8 & 0x200) | uVar8 & 0x3ff;
    uVar14 = -(uVar8 >> 10 & 0x200);
    uVar19 = -(uVar8 >> 0x14 & 0x200) | uVar8 >> 0x14 & 0x3ff;
    uVar18 = -(uVar8 >> 0x1e & 0xfffffffe);
    uVar16 = uVar19;
    if (*pCVar17 != RGBA) {
      uVar16 = uVar15;
      uVar15 = uVar19;
    }
    auVar47._12_4_ = uVar18 | uVar8 >> 0x1e;
    auVar47._8_4_ = uVar16;
    auVar47._4_4_ = uVar14 | uVar8 >> 10 & 0x3ff;
    auVar47._0_4_ = uVar15;
    auVar34 = _DAT_0094ee90 & auVar47 | _DAT_0094eea0;
    TVar24 = auVar34._0_8_;
    auVar50._0_4_ = ((float)(uVar15 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar34._0_4_;
    auVar50._4_4_ = ((float)(uVar14 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar34._4_4_;
    auVar50._8_4_ = ((float)(uVar16 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar34._8_4_;
    auVar50._12_4_ = ((float)(uVar18 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar34._12_4_;
LAB_008f4989:
    TVar40 = auVar50._0_8_;
    (this->m_format).order = (int)auVar50._0_8_;
    (this->m_format).type = (int)((ulong)auVar50._0_8_ >> 0x20);
    (this->m_size).m_data[0] = auVar50._8_4_;
    (this->m_size).m_data[1] = auVar50._12_4_;
    break;
  case CHANNELORDER_LAST:
    uVar8 = *puVar21;
    uVar15 = uVar8 & 0x3ff;
    uVar16 = uVar8 >> 10 & 0x3ff;
    uVar18 = uVar8 >> 0x14 & 0x3ff;
    uVar14 = uVar18;
    if (*pCVar17 != RGBA) {
      uVar14 = uVar15;
      uVar15 = uVar18;
    }
    uVar23 = CONCAT44(uVar8 >> 0x1e,uVar14);
LAB_008f488a:
    auVar48._4_4_ = uVar16;
    auVar48._0_4_ = uVar15;
    auVar48._8_8_ = uVar23;
LAB_008f4892:
    TVar40 = auVar48._0_8_;
    auVar36._0_4_ = (float)auVar48._0_4_;
    auVar36._4_4_ = (float)auVar48._4_4_;
    auVar36._8_4_ = (float)auVar48._8_4_;
    auVar36._12_4_ = (float)auVar48._12_4_;
LAB_008f4895:
    TVar24 = auVar36._0_8_;
    (this->m_format).order = (int)auVar36._0_8_;
    (this->m_format).type = (int)((ulong)auVar36._0_8_ >> 0x20);
    (this->m_size).m_data[0] = auVar36._8_4_;
    (this->m_size).m_data[1] = auVar36._12_4_;
    break;
  case DS|I:
    local_34.m_value = *puVar21 & 0x7ff;
    FVar10 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,2u>(&local_34);
    local_38.m_value = *puVar21 >> 0xb & 0x7ff;
    FVar11 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,6,15,2u>(&local_38);
    local_3c.m_value = *puVar21 >> 0x16;
    FVar12 = Float<unsigned_int,8,23,127,3u>::convert<unsigned_int,5,5,15,2u>(&local_3c);
    (this->m_format).order = FVar10.m_value;
    (this->m_format).type = FVar11.m_value;
    (this->m_size).m_data[0] = FVar12.m_value;
    TVar24 = extraout_XMM0_Qa;
    goto LAB_008f4a6e;
  case DS|L:
    uVar8 = *puVar21;
    auVar38._0_4_ = ldexpf(1.0,(uVar8 >> 0x1b) - 0x18);
    auVar38._4_12_ = extraout_var_00;
    TVar24 = auVar38._0_8_;
    auVar51._4_12_ = in_XMM1._4_12_;
    auVar51._0_4_ = (float)(uVar8 & 0x1ff) * auVar38._0_4_;
    TVar40 = auVar51._0_8_;
    (this->m_format).order = (ChannelOrder)auVar51._0_4_;
    (this->m_format).type = (ChannelType)((float)(uVar8 >> 9 & 0x1ff) * auVar38._0_4_);
    (this->m_size).m_data[0] = (int)((float)(uVar8 >> 0x12 & 0x1ff) * auVar38._0_4_);
LAB_008f4a6e:
    (this->m_size).m_data[1] = 0x3f800000;
  }
  VVar53.m_data[2] = (float)TVar40.order;
  VVar53.m_data[3] = (float)TVar40.type;
  VVar53.m_data[0] = (float)TVar24.order;
  VVar53.m_data[1] = (float)TVar24.type;
  return (Vec4)VVar53.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::getPixel (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* pixelPtr = (const deUint8*)getPixelPtr(x, y, z);

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Float(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Float(pixelPtr);
	}

#define UI8(OFFS, COUNT)		((*((const deUint8*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define UI32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define SI32(OFFS, COUNT)		signExtend(UI32(OFFS, COUNT), (COUNT))
#define UN8(OFFS, COUNT)		channelToUnormFloat(UI8 (OFFS, COUNT), (COUNT))
#define UN16(OFFS, COUNT)		channelToUnormFloat(UI16(OFFS, COUNT), (COUNT))
#define UN32(OFFS, COUNT)		channelToUnormFloat(UI32(OFFS, COUNT), (COUNT))
#define SN32(OFFS, COUNT)		channelToSnormFloat(UI32(OFFS, COUNT), (COUNT))

	// Packed formats.
	switch (m_format.type)
	{
		case TextureFormat::UNORM_BYTE_44:				return			  Vec4(UN8 (4,   4), UN8 ( 0,  4), 0.0f, 1.0f);
		case TextureFormat::UNSIGNED_BYTE_44:			return			 UVec4(UI8 (4,   4), UI8 ( 0,  4), 0u, 1u).cast<float>();
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB( Vec4(UN16(11,  5), UN16( 5,  6), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_565:			return swizzleRB(UVec4(UI16(11,  5), UI16( 5,  6), UI16( 0,  5), 1u), m_format.order, TextureFormat::RGB).cast<float>();
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB( Vec4(UN16(10,  5), UN16( 5,  5), UN16( 0,  5), 1.0f), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB( Vec4(UN16(12,  4), UN16( 8,  4), UN16( 4,  4), UN16( 0, 4)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_4444:		return swizzleRB(UVec4(UI16(12,  4), UI16( 8,  4), UI16( 4,  4), UI16( 0, 4)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB( Vec4(UN16(11,  5), UN16( 6,  5), UN16( 1,  5), UN16( 0, 1)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		return swizzleRB(UVec4(UI16(11,  5), UI16( 6,  5), UI16( 1,  5), UI16( 0, 1)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNORM_INT_101010:			return			  Vec4(UN32(22, 10), UN32(12, 10), UN32( 2, 10), 1.0f);
		case TextureFormat::UNORM_INT_1010102_REV:		return swizzleRB( Vec4(UN32( 0, 10), UN32(10, 10), UN32(20, 10), UN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::SNORM_INT_1010102_REV:		return swizzleRB( Vec4(SN32( 0, 10), SN32(10, 10), SN32(20, 10), SN32(30, 2)), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB( UVec4(UI32(0, 10), UI32(10, 10), UI32(20, 10), UI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB( UVec4(SI32(0, 10), SI32(10, 10), SI32(20, 10), SI32(30, 2)), m_format.order, TextureFormat::RGBA).cast<float>();
		case TextureFormat::UNSIGNED_INT_999_E5_REV:	return unpackRGB999E5(*((const deUint32*)pixelPtr));

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return Vec4(UN16(15, 1), UN16(10, 5), UN16(5, 5), UN16(0, 5)).swizzle(1,2,3,0); // ARGB -> RGBA

		case TextureFormat::UNSIGNED_INT_11F_11F_10F_REV:
			return Vec4(Float11(UI32(0, 11)).asFloat(), Float11(UI32(11, 11)).asFloat(), Float10(UI32(22, 10)).asFloat(), 1.0f);

		default:
			break;
	}

#undef UN8
#undef UN16
#undef UN32
#undef SN32
#undef SI32
#undef UI8
#undef UI16
#undef UI32

	// Generic path.
	Vec4							result;
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToFloat(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0.0f;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1.0f;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}